

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

ColorTracker * __thiscall ColorTracker::getHSV(ColorTracker *this,Mat *imgBGR)

{
  ProcessingException *this_00;
  int in_R8D;
  allocator local_15a;
  allocator local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((*(uint *)imgBGR & 0xff8) == 0x10) {
    cv::Mat::Mat((Mat *)this);
    local_138.field_2._M_allocated_capacity = 0;
    local_158.field_2._M_allocated_capacity = 0;
    local_138._M_dataplus._M_p._0_4_ = 0x1010000;
    local_158._M_dataplus._M_p._0_4_ = 0x2010000;
    local_158._M_string_length = (size_type)this;
    local_138._M_string_length = (size_type)imgBGR;
    cv::cvtColor((cv *)&local_138,(_InputArray *)&local_158,(_OutputArray *)0x28,0,in_R8D);
    return this;
  }
  this_00 = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_159);
  std::operator+(&local_b8,"in ",&local_d8);
  std::operator+(&local_98,&local_b8,", at Line ");
  std::__cxx11::to_string(&local_f8,0x9d);
  std::operator+(&local_78,&local_98,&local_f8);
  std::operator+(&local_58,&local_78,", ");
  std::__cxx11::string::string((string *)&local_118,"getHSV",&local_15a);
  std::operator+(&local_38,&local_58,&local_118);
  std::operator+(&local_158,&local_38,"(): ");
  std::operator+(&local_138,&local_158,"invalid input: passed image must have 3 channels");
  ProcessingException::ProcessingException(this_00,&local_138);
  __cxa_throw(this_00,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Mat ColorTracker::getHSV(const Mat& imgBGR){
    if(imgBGR.channels()!=3){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 3 channels");
    }

    Mat imgHSV;
    cv::cvtColor(imgBGR,imgHSV,cv::COLOR_BGR2HSV);

    return imgHSV;
}